

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.h
# Opt level: O2

void __thiscall
cmExportLibraryDependenciesCommand::~cmExportLibraryDependenciesCommand
          (cmExportLibraryDependenciesCommand *this)

{
  ~cmExportLibraryDependenciesCommand(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    return new cmExportLibraryDependenciesCommand;
  }